

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

void __thiscall ON_Brep::FlipLoop(ON_Brep *this,ON_BrepLoop *loop)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ON_BrepTrim *pOVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  iVar1 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count;
  uVar2 = (loop->m_ti).m_count;
  ON_SimpleArray<int>::Reverse(&loop->m_ti);
  uVar6 = 0;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = uVar6;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    iVar3 = (loop->m_ti).m_a[uVar6];
    lVar5 = (long)iVar3;
    if ((-1 < lVar5) && (iVar3 < iVar1)) {
      pOVar4 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
      (*pOVar4[lVar5].super_ON_CurveProxy.super_ON_Curve.super_ON_Geometry.super_ON_Object.
        _vptr_ON_Object[0x38])(pOVar4 + lVar5);
    }
  }
  return;
}

Assistant:

void 
ON_Brep::FlipLoop(ON_BrepLoop& loop)
{
  int ti, lti;
  const int brep_trim_count = m_T.Count();
  const int loop_trim_count = loop.m_ti.Count();

  // reverse order of trimming curves
  loop.m_ti.Reverse();
  // reverse direction of individual trimming curves
  for ( lti = 0; lti < loop_trim_count; lti++ ) 
  {
    ti = loop.m_ti[lti];
    if ( ti >= 0 && ti < brep_trim_count ) 
    {
      m_T[ti].Reverse();
    }
  }
}